

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_byte_string(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
                 *this,byte_string_type *v,error_code *ec)

{
  pointer puVar1;
  pointer pvVar2;
  pointer puVar3;
  char_result<unsigned_char> cVar4;
  undefined6 extraout_var;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar5;
  size_t sVar6;
  assertion_error *this_00;
  allocator<char> local_69;
  anon_class_8_1_54a39816 func;
  
  puVar1 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  cVar4 = stream_source<unsigned_char>::peek(&this->source_);
  if (((uint)CONCAT62(extraout_var,cVar4) >> 8 & 1) == 0) {
    sVar6 = CONCAT62(extraout_var,cVar4) & 0xffffffe0;
    if ((char)sVar6 != '@') {
      this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&func,
                 "assertion \'major_type == jsoncons::cbor::detail::cbor_major_type::byte_string\' failed at  <> :0"
                 ,&local_69);
      assertion_error::assertion_error(this_00,(string *)&func);
      __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((~cVar4.value & 0x1f) == 0) {
      func.v = v;
      basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
      iterate_string_chunks<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::read_byte_string(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::error_code&)::_lambda(jsoncons::stream_source<unsigned_char>&,unsigned_long,std::error_code&)_1_>
                ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
                 this,&func,byte_string,ec);
    }
    else {
      v_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)get_size(this,ec);
      if (ec->_M_value == 0) {
        pvVar5 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 source_reader<jsoncons::stream_source<unsigned_char>>::
                 read<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           ((source_reader<jsoncons::stream_source<unsigned_char>> *)&this->source_,
                            (stream_source<unsigned_char> *)v,v_00,sVar6);
        if (pvVar5 != v_00) goto LAB_001fff97;
        pvVar2 = (this->stringref_map_stack_).
                 super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->stringref_map_stack_).
            super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != pvVar2) {
          puVar1 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          puVar3 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          sVar6 = detail::min_length_for_stringref
                            ((long)pvVar2[-1].
                                   super__Vector_base<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)pvVar2[-1].
                                   super__Vector_base<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 6);
          if (sVar6 <= (ulong)((long)puVar1 - (long)puVar3)) {
            pvVar2 = (this->stringref_map_stack_).
                     super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            mapped_string::mapped_string
                      ((mapped_string *)&func,v,(allocator_type *)&this->field_0x28);
            std::
            vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::mapped_string,std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::mapped_string>>
            ::
            emplace_back<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::mapped_string>
                      ((vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::mapped_string,std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::mapped_string>>
                        *)(pvVar2 + -1),(mapped_string *)&func);
            mapped_string::~mapped_string((mapped_string *)&func);
          }
        }
      }
    }
    return;
  }
LAB_001fff97:
  std::error_code::operator=(ec,unexpected_eof);
  return;
}

Assistant:

void read_byte_string(byte_string_type& v, std::error_code& ec)
    {
        v.clear();
        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            return;
        }
        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(c.value);
        uint8_t info = get_additional_information_value(c.value);

        JSONCONS_ASSERT(major_type == jsoncons::cbor::detail::cbor_major_type::byte_string);

        switch(info)
        {
            case jsoncons::cbor::detail::additional_info::indefinite_length:
            {
                auto func = [&v](Source& source, std::size_t length, std::error_code& ec) -> bool
                {
                    if (source_reader<Source>::read(source, v, length) != length)
                    {
                        ec = cbor_errc::unexpected_eof;
                        return false;
                    }
                    return true;
                };
                iterate_string_chunks(func, major_type, ec);
                break;
            }
            default:
            {
                std::size_t length = get_size(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                if (source_reader<Source>::read(source_, v, length) != length)
                {
                    ec = cbor_errc::unexpected_eof;
                    return;
                }
                if (!stringref_map_stack_.empty() &&
                    v.size() >= jsoncons::cbor::detail::min_length_for_stringref(stringref_map_stack_.back().size()))
                {
                    stringref_map_stack_.back().emplace_back(mapped_string(v, alloc_));
                }
                break;
            }

        }
    }